

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O0

int i2d_PKCS7_ISSUER_AND_SUBJECT_bio(BIO *bio,PKCS7_ISSUER_AND_SUBJECT *ias)

{
  uchar *puStack_28;
  int len;
  uchar *pout;
  PKCS7_ISSUER_AND_SUBJECT *ias_local;
  BIO *bio_local;
  
  puStack_28 = (uchar *)0x0;
  if ((bio == (BIO *)0x0) || (ias == (PKCS7_ISSUER_AND_SUBJECT *)0x0)) {
    bio_local._4_4_ = 0;
  }
  else {
    pout = (uchar *)ias;
    ias_local = (PKCS7_ISSUER_AND_SUBJECT *)bio;
    bio_local._4_4_ = i2d_PKCS7_ISSUER_AND_SUBJECT(ias,&stack0xffffffffffffffd8);
    if ((bio_local._4_4_ < 1) || (puStack_28 == (uchar *)0x0)) {
      bio_local._4_4_ = 0;
    }
    else {
      BIO_write((BIO *)ias_local,puStack_28,bio_local._4_4_);
      CRYPTO_free(puStack_28);
    }
  }
  return bio_local._4_4_;
}

Assistant:

int i2d_PKCS7_ISSUER_AND_SUBJECT_bio(BIO *bio, PKCS7_ISSUER_AND_SUBJECT *ias) {
	unsigned char * pout = NULL;
	int len = 0;

	if (!bio || !ias)
		return 0;

	len = i2d_PKCS7_ISSUER_AND_SUBJECT(ias, &pout);

	if (len <= 0 || !pout)
		return 0;

	BIO_write(bio, pout, len);
	OPENSSL_free(pout);

	return len;
}